

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

void __thiscall
duckdb::RenameTableInfo::RenameTableInfo
          (RenameTableInfo *this,AlterEntryData *data,string *new_name_p)

{
  AlterEntryData local_80;
  
  AlterEntryData::AlterEntryData(&local_80,data);
  AlterTableInfo::AlterTableInfo(&this->super_AlterTableInfo,RENAME_TABLE,&local_80);
  AlterEntryData::~AlterEntryData(&local_80);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__RenameTableInfo_027a7ba0;
  ::std::__cxx11::string::string((string *)&this->new_table_name,(string *)new_name_p);
  return;
}

Assistant:

RenameTableInfo::RenameTableInfo(AlterEntryData data, string new_name_p)
    : AlterTableInfo(AlterTableType::RENAME_TABLE, std::move(data)), new_table_name(std::move(new_name_p)) {
}